

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipcommunication.c
# Opt level: O2

int ipcmd_recv_tcp(ipcmd_t *ipcmd,YPSpur_msg *data)

{
  int iVar1;
  ipcmd_tcp_type_t iVar2;
  YPSpur_msg *pYVar3;
  uint __i;
  int iVar4;
  long lVar5;
  char *pcVar6;
  ssize_t sVar7;
  ulong uVar8;
  ulong uStack_e0;
  uint addr_size;
  YPSpur_msg *local_c8;
  sockaddr_in client;
  fd_set fds;
  
  if ((ipcmd != (ipcmd_t *)0x0) && (ipcmd->connection_error == 0)) {
    uStack_e0 = 0x40;
    local_c8 = data;
    while( true ) {
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
        fds.__fds_bits[lVar5] = 0;
      }
      iVar4 = ipcmd->socket;
      fds.__fds_bits[iVar4 / 0x40] = fds.__fds_bits[iVar4 / 0x40] | 1L << ((byte)iVar4 & 0x3f);
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 1) {
        iVar1 = ipcmd->clients[lVar5];
        if ((iVar1 != -1) &&
           (fds.__fds_bits[iVar1 / 0x40] = fds.__fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f)
           , iVar4 <= iVar1)) {
          iVar4 = iVar1;
        }
      }
      iVar4 = select(iVar4 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      pYVar3 = local_c8;
      if (iVar4 == 0) break;
      iVar2 = ipcmd->tcp_type;
      iVar4 = ipcmd->socket;
      if (((ulong)fds.__fds_bits[iVar4 / 0x40] >> ((long)iVar4 % 0x40 & 0x3fU) & 1) == 0) {
        if (iVar2 != IPCMD_TCP_CLIENT) {
          uVar8 = 0;
          uStack_e0 = 0x40;
          goto LAB_00103d19;
        }
LAB_00103cb2:
        uVar8 = 0;
        goto LAB_00103cb5;
      }
      if (iVar2 == IPCMD_TCP_CLIENT) goto LAB_00103cb2;
      addr_size = 0x10;
      iVar4 = accept(iVar4,(sockaddr *)&client,&addr_size);
      if (iVar4 < 1) {
        pcVar6 = "Invalid socket.\n";
        goto LAB_00103c87;
      }
      uVar8 = 0;
      while( true ) {
        if (uVar8 == 0x40) {
          pcVar6 = "Too many connection requests.\n";
          goto LAB_00103c87;
        }
        if (ipcmd->clients[uVar8] == -1) break;
        uVar8 = uVar8 + 1;
      }
      ipcmd->clients[uVar8] = iVar4;
      pcVar6 = inet_ntoa((in_addr)client.sin_addr.s_addr);
      yprintf(OUTPUT_LV_INFO,"Connection %d accepted from %s.\n",uVar8 & 0xffffffff,pcVar6);
    }
    pcVar6 = "Couldn\'t select the socket.\n";
LAB_00103c87:
    yprintf(OUTPUT_LV_ERROR,pcVar6);
  }
  return -1;
LAB_00103d19:
  if (uVar8 == 0x40) goto LAB_00103cd7;
  iVar4 = ipcmd->clients[uVar8];
  if (((ulong)fds.__fds_bits[iVar4 / 0x40] >> ((long)iVar4 % 0x40 & 0x3fU) & 1) != 0) {
    uStack_e0 = uVar8 & 0xffffffff;
LAB_00103cb5:
    sVar7 = recv(iVar4,local_c8,0x38,0);
    pYVar3->pid = uVar8;
    if ((int)sVar7 < 1) {
      iVar2 = ipcmd->tcp_type;
LAB_00103cd7:
      if (iVar2 == IPCMD_TCP_CLIENT) {
        yprintf(OUTPUT_LV_INFO,"Connection closed.\n");
        ipcmd->connection_error = 1;
        shutdown(ipcmd->socket,2);
        return -1;
      }
      yprintf(OUTPUT_LV_INFO,"Connection %d closed.\n",uStack_e0);
      ipcmd->clients[(int)uStack_e0] = -1;
    }
    return 0x38;
  }
  uVar8 = uVar8 + 1;
  goto LAB_00103d19;
}

Assistant:

int ipcmd_recv_tcp(struct ipcmd_t* ipcmd, YPSpur_msg* data)
{
  fd_set fds;
  struct sockaddr_in client;
  int sock;
  int i;
  size_t len = sizeof(YPSpur_msg);

  if (ipcmd == NULL || ipcmd->connection_error)
    return -1;

  do
  {
    int recved;
    while (1)
    {
      SIZE_TYPE addr_size;
      int nfds = 0;

      FD_ZERO(&fds);
      FD_SET(ipcmd->socket, &fds);
      if (nfds < ipcmd->socket)
        nfds = ipcmd->socket;
      for (i = 0; i < YPSPUR_MAX_SOCKET; i++)
      {
        if (ipcmd->clients[i] != -1)
        {
          FD_SET(ipcmd->clients[i], &fds);
          if (nfds < ipcmd->clients[i])
            nfds = ipcmd->clients[i];
        }
      }

      nfds++;
      if (!select(nfds, &fds, NULL, NULL, NULL))
      {
        yprintf(OUTPUT_LV_ERROR, "Couldn't select the socket.\n");
        return -1;
      }
      if (!FD_ISSET(ipcmd->socket, &fds))
      {
        break;
      }
      if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
      {
        break;
      }

      addr_size = sizeof(client);
      sock = accept(ipcmd->socket, (struct sockaddr*)&client, &addr_size);
      if (sock <= 0)
      {
        yprintf(OUTPUT_LV_ERROR, "Invalid socket.\n");
        return -1;
      }
      for (i = 0; i < YPSPUR_MAX_SOCKET; i++)
      {
        if (ipcmd->clients[i] == -1)
        {
          break;
        }
      }
      if (i == YPSPUR_MAX_SOCKET)
      {
        yprintf(OUTPUT_LV_ERROR, "Too many connection requests.\n");
        return -1;
      }
      ipcmd->clients[i] = sock;
      yprintf(OUTPUT_LV_INFO, "Connection %d accepted from %s.\n", i, inet_ntoa(client.sin_addr));
    }

    recved = -1;
    if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
    {
      recved = recv(ipcmd->socket, (SOCK_DATATYPE)data, len, 0);
      data->pid = 0;
    }
    else
    {
      for (i = 0; i < YPSPUR_MAX_SOCKET; i++)
      {
        if (FD_ISSET(ipcmd->clients[i], &fds))
        {
          recved = recv(ipcmd->clients[i], (SOCK_DATATYPE)data, len, 0);
          data->pid = i;
          break;
        }
      }
    }
    if (recved <= 0)
    {
      if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
      {
        yprintf(OUTPUT_LV_INFO, "Connection closed.\n");
        ipcmd->connection_error = 1;
        shutdown(ipcmd->socket, SOCK_SHUTDOWN_OPTION);
        return -1;
      }
      yprintf(OUTPUT_LV_INFO, "Connection %d closed.\n", i);
      ipcmd->clients[i] = -1;
      continue;
    }
  }
  while (0);
  return len;
}